

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

cf_bool_t cf_array_insert(cf_array_t *self,int index,cf_void_t *elm,cf_size_t size)

{
  cf_void_t *dst;
  cf_size_t cVar1;
  long lVar2;
  ulong uVar3;
  cf_bool_t cVar4;
  ulong uVar5;
  
  if (self->elm_size < size) {
    __assert_fail("size <= self->elm_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/array.c"
                  ,0x38,"cf_bool_t cf_array_insert(cf_array_t *, int, cf_void_t *, cf_size_t)");
  }
  uVar3 = (ulong)(uint)index;
  cVar4 = 0;
  if ((-2 < index) && (cVar1 = self->elm_count, cVar4 = 0, index <= (int)cVar1)) {
    if (cVar1 == self->capacity) {
      cVar1 = self->elm_size * cVar1 * 2;
      dst = cf_malloc_dbg(cVar1,0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/array.c"
                          ,"cf_array_insert",0x42);
      if (dst == (cf_void_t *)0x0) {
        return 0;
      }
      cf_memcpy_s(dst,cVar1,self->elm_start,self->elm_size * self->elm_count);
      cf_free_dbg(self->elm_start,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/array.c"
                  ,"cf_array_insert",0x48);
      self->elm_start = dst;
      self->capacity = self->capacity << 1;
    }
    if (index == -1) {
      cVar1 = self->elm_size;
      uVar3 = self->elm_count;
    }
    else {
      uVar5 = (ulong)(uint)self->elm_count;
      while (index < (int)uVar5) {
        cVar1 = self->elm_size;
        lVar2 = uVar5 * cVar1;
        uVar5 = (ulong)((int)uVar5 - 1);
        cf_memcpy_s((cf_void_t *)(lVar2 + (long)self->elm_start),cVar1,
                    (cf_void_t *)(uVar5 * cVar1 + (long)self->elm_start),cVar1);
      }
      cVar1 = self->elm_size;
    }
    cf_memcpy_s((cf_void_t *)(uVar3 * cVar1 + (long)self->elm_start),cVar1,elm,cVar1);
    self->elm_count = self->elm_count + 1;
    cVar4 = 1;
  }
  return cVar4;
}

Assistant:

cf_bool_t cf_array_insert(cf_array_t* self, int index, cf_void_t* elm, cf_size_t size) {
    int i;
    cf_size_t new_memory_size = 0;
    cf_void_t* new_memory = CF_NULL_PTR;
    
    cf_assert(size <= self->elm_size);

    // out of range
    if (index < CF_ARRAY_END_INDEX || index > CF_TYPE_CAST(int, self->elm_count)) {
        return CF_FALSE;
    }

    // expand
    if (self->elm_count == self->capacity) {
        new_memory_size = self->elm_size * self->capacity * 2;
        new_memory = cf_malloc(new_memory_size);
        if (new_memory == CF_NULL_PTR) {
            return CF_FALSE;
        }
        cf_memcpy_s(new_memory, new_memory_size, self->elm_start, self->elm_count * self->elm_size);

        cf_free(self->elm_start);
        self->elm_start = new_memory;
        self->capacity *= 2;
    }

    // append to last
    if (index == CF_ARRAY_END_INDEX) {
        cf_memcpy_s((cf_uint8_t*)self->elm_start + self->elm_size * self->elm_count,
            self->elm_size,
            elm,
            self->elm_size);
        self->elm_count += 1;
        return CF_TRUE;
    }

    i = index;
    for (i = self->elm_count; i > index; i--) {
        cf_memcpy_s((cf_uint8_t*)self->elm_start + self->elm_size * i,
            self->elm_size,
            (cf_uint8_t*)self->elm_start + self->elm_size * (i - 1),
            self->elm_size);
    }
    cf_memcpy_s((cf_uint8_t*)self->elm_start + self->elm_size * index,
            self->elm_size,
            elm,
            self->elm_size);
    self->elm_count += 1;

    return CF_TRUE;
}